

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMixedMeshControl::GroupandCondenseElements(TPZMHMixedMeshControl *this)

{
  bool bVar1;
  TPZCompEl *pTVar2;
  long in_RDI;
  TPZAutoPointer<TPZGuiInterface> guiInterface;
  int preconditioned;
  int numthreads;
  bool keeplagrange;
  TPZSubCompMesh *subcmesh;
  TPZCompEl *cel;
  iterator it;
  TPZAutoPointer<TPZGuiInterface> *in_stack_000000d0;
  int in_stack_000000d8;
  int in_stack_000000dc;
  TPZSubCompMesh *in_stack_000000e0;
  TPZCompMesh *in_stack_00000300;
  size_t in_stack_00000388;
  char *in_stack_00000390;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_ffffffffffffff68;
  TPZCompMesh *in_stack_ffffffffffffff70;
  TPZCompMesh *this_00;
  undefined4 in_stack_ffffffffffffffcc;
  undefined2 uVar4;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffd4;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_Base_ptr)
       std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::begin
                 (in_stack_ffffffffffffff68);
  while( true ) {
    uVar4 = SUB42(in_stack_ffffffffffffffcc,2);
    local_18._M_node =
         (_Base_ptr)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                   (in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
    std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x1f641c7);
    pTVar2 = TPZCompMesh::Element(in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68);
    if (pTVar2 == (TPZCompEl *)0x0) {
      in_stack_ffffffffffffff70 = (TPZCompMesh *)0x0;
    }
    else {
      in_stack_ffffffffffffff70 =
           (TPZCompMesh *)
           __dynamic_cast(pTVar2,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
    }
    this_00 = in_stack_ffffffffffffff70;
    if (in_stack_ffffffffffffff70 == (TPZCompMesh *)0x0) {
      pzinternal::DebugStopImpl(in_stack_00000390,in_stack_00000388);
    }
    TPZCompMeshTools::GroupElements(in_stack_00000300);
    (**(code **)(*(long *)in_stack_ffffffffffffff70 + 0x78))();
    in_stack_ffffffffffffffd4 = CONCAT13(1,(int3)in_stack_ffffffffffffffd4);
    TPZCompMeshTools::CreatedCondensedElements
              ((TPZCompMesh *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               SUB21(uVar4,1),SUB21(uVar4,0));
    (**(code **)(*(long *)in_stack_ffffffffffffff70 + 0x88))();
    uVar5 = 0;
    uVar3 = 0;
    in_stack_ffffffffffffff68 =
         (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
         &stack0xffffffffffffffc0;
    TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer((TPZAutoPointer<TPZGuiInterface> *)this_00);
    in_stack_ffffffffffffffcc = uVar3;
    in_stack_ffffffffffffffd0 = uVar5;
    TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
              ((TPZAutoPointer<TPZGuiInterface> *)in_stack_ffffffffffffff70,
               (TPZAutoPointer<TPZGuiInterface> *)in_stack_ffffffffffffff68);
    TPZSubCompMesh::SetAnalysisSkyline
              (in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d0);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
              ((TPZAutoPointer<TPZGuiInterface> *)in_stack_ffffffffffffff70);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
              ((TPZAutoPointer<TPZGuiInterface> *)in_stack_ffffffffffffff70);
    std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)CONCAT44(uVar3,uVar5),
               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  }
  return;
}

Assistant:

void TPZMHMixedMeshControl::GroupandCondenseElements()
{
    for (std::map<int64_t,int64_t>::iterator it=fMHMtoSubCMesh.begin(); it != fMHMtoSubCMesh.end(); it++) {
        TPZCompEl *cel = fCMesh->Element(it->second);
        TPZSubCompMesh *subcmesh = dynamic_cast<TPZSubCompMesh *>(cel);
        if (!subcmesh) {
            DebugStop();
        }
        TPZCompMeshTools::GroupElements(subcmesh);
        subcmesh->ComputeNodElCon();
        
#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            subcmesh->Print(sout);
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
        // TODO: increment nelconnected of exterior connects
        bool keeplagrange = true;
        TPZCompMeshTools::CreatedCondensedElements(subcmesh, keeplagrange);
        subcmesh->CleanUpUnconnectedNodes();
        int numthreads = 0;
        int preconditioned = 0;
#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            subcmesh->Print(sout);
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
        TPZAutoPointer<TPZGuiInterface> guiInterface;
        subcmesh->SetAnalysisSkyline(numthreads, preconditioned, guiInterface);
    }
    
}